

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioWaveGetHighPulses(void)

{
  int iVar1;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioWaveGetHighPulses_cold_1();
  }
  iVar1 = wfStats_4;
  if ((libInitialised == '\0') && (iVar1 = -0x1f, (gpioCfg.internals >> 10 & 1) == 0)) {
    gpioWaveGetHighPulses_cold_2();
  }
  return iVar1;
}

Assistant:

int gpioWaveGetHighPulses(void)
{
   DBG(DBG_USER, "");

   CHECK_INITED;

   return wfStats.highPulses;
}